

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O1

char * filesystem_print_info(void)

{
  return 
  "File System Library 0.8.8\nCopyright (C) 2016 - 2025 Vicente Eduardo Ferrer Garcia <vic798@gmail.com>\nCompiled as shared library type\n"
  ;
}

Assistant:

const char *filesystem_print_info(void)
{
	static const char filesystem_info[] =
		"File System Library " METACALL_VERSION "\n"
		"Copyright (C) 2016 - 2025 Vicente Eduardo Ferrer Garcia <vic798@gmail.com>\n"

#ifdef FILESYSTEM_STATIC_DEFINE
		"Compiled as static library type"
#else
		"Compiled as shared library type"
#endif

		"\n";

	return filesystem_info;
}